

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMSlicer.h
# Opt level: O3

uint32_t __thiscall
dg::llvmdg::LLVMSlicer::slice
          (LLVMSlicer *this,LLVMDependenceGraph *dg,LLVMNode *start,uint32_t sl_id)

{
  undefined8 *puVar1;
  Value *pVVar2;
  StringRef SVar3;
  Function **ppFVar4;
  iterator iVar5;
  bool bVar6;
  char cVar7;
  undefined *puVar8;
  uint uVar9;
  undefined *puVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  Function *pFVar14;
  StringRef SVar15;
  vector<llvm::Function_*,_std::allocator<llvm::Function_*>_> to_erase;
  Function **local_58;
  iterator iStack_50;
  Function **local_48;
  StringRef local_40;
  
  if (start != (LLVMNode *)0x0) {
    sl_id = Slicer<dg::LLVMNode>::mark(&this->super_Slicer<dg::LLVMNode>,start,sl_id,false);
  }
  SVar15.Length = local_40.Length;
  SVar15.Data = local_40.Data;
  local_58 = (Function **)0x0;
  iStack_50._M_current = (Function **)0x0;
  local_48 = (Function **)0x0;
  lVar13 = *(long *)(*(long *)(dg + 0x140) + 0x20);
  lVar12 = *(long *)(dg + 0x140) + 0x18;
  if (lVar13 != lVar12) {
    do {
      pFVar14 = (Function *)(lVar13 - 0x38);
      if (lVar13 == 0) {
        pFVar14 = (Function *)0x0;
      }
      local_40 = SVar15;
      SVar15 = (StringRef)llvm::Value::getName();
      local_40 = SVar15;
      bVar6 = dontTouch(this,&local_40);
      SVar15 = local_40;
      if (!bVar6) {
        puVar8 = &llvm::cl::Option::vtable;
        puVar10 = __M_insert<long>;
        if (__M_insert<long> != (undefined *)0x0) {
          do {
            if (*(Function **)(puVar10 + 0x20) >= pFVar14) {
              puVar8 = puVar10;
            }
            puVar1 = (undefined8 *)
                     (puVar10 + (ulong)(*(Function **)(puVar10 + 0x20) < pFVar14) * 8 + 0x10);
            puVar10 = (undefined *)*puVar1;
          } while ((undefined *)*puVar1 != (undefined *)0x0);
          if ((puVar8 != &llvm::cl::Option::vtable) && (*(Function **)(puVar8 + 0x20) <= pFVar14)) {
            sliceGraph(this,*(LLVMDependenceGraph **)(puVar8 + 0x28),sl_id);
            SVar15 = local_40;
            goto LAB_00127f26;
          }
        }
        cVar7 = llvm::GlobalValue::isDeclaration();
        SVar3.Length = local_40.Length;
        SVar3.Data = (char *)pFVar14;
        SVar15 = local_40;
        if (cVar7 == '\0') {
          if (iStack_50._M_current == local_48) {
            local_40.Data = (char *)pFVar14;
            std::vector<llvm::Function*,std::allocator<llvm::Function*>>::
            _M_realloc_insert<llvm::Function*>
                      ((vector<llvm::Function*,std::allocator<llvm::Function*>> *)&local_58,
                       iStack_50,(Function **)&local_40);
            SVar15.Length = local_40.Length;
            SVar15.Data = local_40.Data;
          }
          else {
            *iStack_50._M_current = pFVar14;
            iStack_50._M_current = iStack_50._M_current + 1;
            SVar15 = SVar3;
          }
        }
      }
LAB_00127f26:
      iVar5._M_current = iStack_50._M_current;
      lVar13 = *(long *)(lVar13 + 8);
      ppFVar4 = local_58;
      local_40 = SVar15;
    } while (lVar13 != lVar12);
    for (; ppFVar4 != iVar5._M_current; ppFVar4 = ppFVar4 + 1) {
      pVVar2 = (Value *)*ppFVar4;
      llvm::UndefValue::get(*(Type **)pVVar2);
      llvm::Value::replaceAllUsesWith(pVVar2);
      llvm::Function::dropAllReferences();
      uVar9 = *(uint *)(pVVar2 + 0x20) & 0xfffffff0;
      uVar11 = uVar9 | 0x4000;
      if ((*(uint *)(pVVar2 + 0x20) & 0x30) == 0) {
        uVar11 = uVar9;
      }
      *(uint *)(pVVar2 + 0x20) = uVar11;
      llvm::Function::eraseFromParent();
    }
    if (local_58 != (Function **)0x0) {
      operator_delete(local_58,(long)local_48 - (long)local_58);
    }
  }
  return sl_id;
}

Assistant:

uint32_t slice(LLVMDependenceGraph *dg, LLVMNode *start,
                   uint32_t sl_id = 0) {
        // mark nodes for slicing
        assert(start || sl_id != 0);
        if (start)
            sl_id = mark(start, sl_id);

        std::vector<llvm::Function *> to_erase;
        for (auto &F : *dg->getModule()) {
            if (dontTouch(F.getName()))
                continue;

            auto it = constructedFunctions.find(&F);
            if (it == constructedFunctions.end()) {
                // remove (defined) functions that we didn't even constructed,
                // those are irrelevant in the slice
                if (!F.isDeclaration()) {
                    to_erase.push_back(&F);
                }
            } else {
                LLVMDependenceGraph *subdg = it->second;
                sliceGraph(subdg, sl_id);
            }
        }
        for (auto *F : to_erase) {
            F->replaceAllUsesWith(llvm::UndefValue::get(F->getType()));
            F->deleteBody();
            F->eraseFromParent();
        }

        return sl_id;
    }